

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_frozen_serialize(roaring_bitmap_t *rb,char *buf)

{
  int *piVar1;
  int iVar2;
  void *__dest;
  void *pvVar3;
  void *__dest_00;
  uint *puVar4;
  int *in_RDI;
  uint32_t header;
  size_t num_bytes_1;
  array_container_t *ac_1;
  size_t num_bytes;
  run_container_t *rc_1;
  bitset_container_t *bc;
  uint16_t count;
  int32_t i_1;
  uint32_t *header_zone;
  uint8_t *typecode_zone;
  uint16_t *count_zone;
  uint16_t *key_zone;
  uint16_t *array_zone;
  rle16_t *run_zone;
  uint64_t *bitset_zone;
  array_container_t *ac;
  run_container_t *rc;
  int32_t i;
  size_t array_zone_size;
  size_t run_zone_size;
  size_t bitset_zone_size;
  roaring_array_t *ra;
  bitset_container_t *in_stack_ffffffffffffff38;
  short local_86;
  int local_84;
  void *local_60;
  void *local_58;
  void *local_50;
  int local_34;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  char *local_10 [2];
  
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  for (local_34 = 0; local_34 < *in_RDI; local_34 = local_34 + 1) {
    if (*(char *)(*(long *)(in_RDI + 6) + (long)local_34) == '\x01') {
      local_20 = local_20 + 0x2000;
    }
    else if (*(char *)(*(long *)(in_RDI + 6) + (long)local_34) == '\x02') {
      local_30 = (long)**(int **)(*(long *)(in_RDI + 2) + (long)local_34 * 8) * 2 + local_30;
    }
    else {
      local_28 = (long)**(int **)(*(long *)(in_RDI + 2) + (long)local_34 * 8) * 4 + local_28;
    }
  }
  local_50 = arena_alloc(local_10,local_20);
  local_58 = arena_alloc(local_10,local_28);
  local_60 = arena_alloc(local_10,local_30);
  __dest = arena_alloc(local_10,(long)(*in_RDI << 1));
  pvVar3 = arena_alloc(local_10,(long)(*in_RDI << 1));
  __dest_00 = arena_alloc(local_10,(long)*in_RDI);
  puVar4 = (uint *)arena_alloc(local_10,4);
  for (local_84 = 0; local_84 < *in_RDI; local_84 = local_84 + 1) {
    if (*(char *)(*(long *)(in_RDI + 6) + (long)local_84) == '\x01') {
      piVar1 = *(int **)(*(long *)(in_RDI + 2) + (long)local_84 * 8);
      memcpy(local_50,*(void **)(piVar1 + 2),0x2000);
      local_50 = (void *)((long)local_50 + 0x2000);
      if (*piVar1 == -1) {
        iVar2 = bitset_container_compute_cardinality(in_stack_ffffffffffffff38);
        local_86 = (short)iVar2;
      }
      else {
        local_86 = (short)*piVar1;
      }
      local_86 = local_86 + -1;
    }
    else if (*(char *)(*(long *)(in_RDI + 6) + (long)local_84) == '\x02') {
      piVar1 = *(int **)(*(long *)(in_RDI + 2) + (long)local_84 * 8);
      memcpy(local_60,*(void **)(piVar1 + 2),(long)*piVar1 << 1);
      local_60 = (void *)((long)local_60 + (long)*piVar1 * 2);
      local_86 = (short)*piVar1 + -1;
    }
    else {
      piVar1 = *(int **)(*(long *)(in_RDI + 2) + (long)local_84 * 8);
      memcpy(local_58,*(void **)(piVar1 + 2),(long)*piVar1 << 2);
      local_58 = (void *)((long)local_58 + (long)*piVar1 * 4);
      local_86 = (short)*piVar1;
    }
    *(short *)((long)pvVar3 + (long)local_84 * 2) = local_86;
  }
  memcpy(__dest,*(void **)(in_RDI + 4),(long)*in_RDI << 1);
  memcpy(__dest_00,*(void **)(in_RDI + 6),(long)*in_RDI);
  *puVar4 = *in_RDI << 0xf | 0x35c6;
  return;
}

Assistant:

void roaring_bitmap_frozen_serialize(const roaring_bitmap_t *rb, char *buf) {
    /*
     * Note: we do not require user to supply a specifically aligned buffer.
     * Thus we have to use memcpy() everywhere.
     */

    const roaring_array_t *ra = &rb->high_low_container;

    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_zone_size +=
                    BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                run_zone_size += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                array_zone_size += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }

    uint64_t *bitset_zone = (uint64_t *)arena_alloc(&buf, bitset_zone_size);
    rle16_t *run_zone = (rle16_t *)arena_alloc(&buf, run_zone_size);
    uint16_t *array_zone = (uint16_t *)arena_alloc(&buf, array_zone_size);
    uint16_t *key_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint16_t *count_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint8_t *typecode_zone = (uint8_t *)arena_alloc(&buf, ra->size);
    uint32_t *header_zone = (uint32_t *)arena_alloc(&buf, 4);

    for (int32_t i = 0; i < ra->size; i++) {
        uint16_t count;
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                const bitset_container_t *bc =
                    const_CAST_bitset(ra->containers[i]);
                memcpy(bitset_zone, bc->words,
                       BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t));
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                if (bc->cardinality != BITSET_UNKNOWN_CARDINALITY) {
                    count = (uint16_t)(bc->cardinality - 1);
                } else {
                    count =
                        (uint16_t)(bitset_container_compute_cardinality(bc) -
                                   1);
                }
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                size_t num_bytes = rc->n_runs * sizeof(rle16_t);
                memcpy(run_zone, rc->runs, num_bytes);
                run_zone += rc->n_runs;
                count = (uint16_t)rc->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                size_t num_bytes = ac->cardinality * sizeof(uint16_t);
                memcpy(array_zone, ac->array, num_bytes);
                array_zone += ac->cardinality;
                count = (uint16_t)(ac->cardinality - 1);
                break;
            }
            default:
                roaring_unreachable;
        }
        memcpy(&count_zone[i], &count, 2);
    }
    memcpy(key_zone, ra->keys, ra->size * sizeof(uint16_t));
    memcpy(typecode_zone, ra->typecodes, ra->size * sizeof(uint8_t));
    uint32_t header = ((uint32_t)ra->size << 15) | FROZEN_COOKIE;
    memcpy(header_zone, &header, 4);
}